

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyBlobAppend(SyBlob *pBlob,void *pData,sxu32 nSize)

{
  void *pvVar1;
  sxu32 sVar2;
  uint uVar3;
  sxu32 sVar4;
  long lVar5;
  
  if (nSize != 0) {
    uVar3 = pBlob->nFlags;
    if ((uVar3 & 3) == 0) {
      if ((uVar3 & 4) == 0) {
        sVar4 = pBlob->mByte;
        sVar2 = pBlob->nByte;
      }
      else {
        if (pBlob->nByte == 0) {
          pBlob->pBlob = (void *)0x0;
          pBlob->mByte = 0;
          sVar4 = 0;
        }
        else {
          pvVar1 = SyMemBackendDup(pBlob->pAllocator,pBlob->pBlob,pBlob->nByte);
          if (pvVar1 == (void *)0x0) {
            return -1;
          }
          pBlob->pBlob = pvVar1;
          sVar4 = pBlob->nByte;
          uVar3 = pBlob->nFlags;
          pBlob->mByte = sVar4;
        }
        pBlob->nFlags = uVar3 & 0xfffffffb;
        sVar2 = sVar4;
      }
      if (sVar4 - sVar2 < nSize) {
        if (sVar4 == 0) {
          sVar4 = 0x10;
          if (0x10 < nSize) {
            sVar4 = nSize;
          }
        }
        else {
          sVar4 = nSize + sVar4 * 2 + 0x10;
        }
        pvVar1 = SyMemBackendRealloc(pBlob->pAllocator,pBlob->pBlob,sVar4);
        if (pvVar1 == (void *)0x0) {
          return -1;
        }
        pBlob->pBlob = pvVar1;
        pBlob->mByte = sVar4;
      }
    }
    else {
      uVar3 = pBlob->mByte - pBlob->nByte;
      if ((uVar3 < nSize) && (nSize = uVar3, pBlob->mByte == pBlob->nByte)) {
        return -0x1d;
      }
    }
    if (pData != (void *)0x0) {
      uVar3 = pBlob->nByte;
      pvVar1 = pBlob->pBlob;
      pBlob->nByte = uVar3 + nSize;
      for (lVar5 = 0;
          (((sVar4 = (sxu32)lVar5, nSize != sVar4 &&
            (*(undefined1 *)((long)pvVar1 + lVar5 + (ulong)uVar3) =
                  *(undefined1 *)((long)pData + lVar5), nSize - 1 != sVar4)) &&
           (*(undefined1 *)((long)pvVar1 + lVar5 + (ulong)uVar3 + 1) =
                 *(undefined1 *)((long)pData + lVar5 + 1), nSize - 2 != sVar4)) &&
          (*(undefined1 *)((long)pvVar1 + lVar5 + (ulong)uVar3 + 2) =
                *(undefined1 *)((long)pData + lVar5 + 2), nSize - 3 != sVar4)); lVar5 = lVar5 + 4) {
        *(undefined1 *)((long)pvVar1 + lVar5 + (ulong)uVar3 + 3) =
             *(undefined1 *)((long)pData + lVar5 + 3);
      }
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBlobAppend(SyBlob *pBlob, const void *pData, sxu32 nSize)
{
	sxu8 *zBlob;
	sxi32 rc;
	if( nSize < 1 ){
		return SXRET_OK;
	}
	rc = BlobPrepareGrow(&(*pBlob), &nSize);
	if( SXRET_OK != rc ){
		return rc;
	}
	if( pData ){
		zBlob = (sxu8 *)pBlob->pBlob ;
		zBlob = &zBlob[pBlob->nByte];
		pBlob->nByte += nSize;
		SX_MACRO_FAST_MEMCPY(pData, zBlob, nSize);
	}
	return SXRET_OK;
}